

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

void __thiscall
Js::ConcatStringBase::CopyImpl
          (ConcatStringBase *this,char16 *buffer,int itemCount,JavascriptString **items,
          StringCopyInfoStack *nestedStringTreeCopyInfos,byte recursionDepth)

{
  JavascriptString *this_00;
  code *pcVar1;
  StringCopyInfo copyInfo;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  int iVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  char16 *str;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  undefined7 in_register_00000089;
  uint uVar8;
  uint uVar9;
  int iVar10;
  StringCopyInfo local_98;
  JavascriptString **local_80;
  JavascriptString **newItems;
  undefined8 local_70;
  StringCopyInfoStack *local_68;
  uint local_5c;
  JavascriptString *local_58;
  undefined4 *local_50;
  undefined8 local_48;
  char16 *local_40;
  JavascriptString **local_38;
  
  local_48 = CONCAT44(in_register_00000014,itemCount);
  local_70 = CONCAT71(in_register_00000089,recursionDepth);
  local_68 = nestedStringTreeCopyInfos;
  local_58 = (JavascriptString *)this;
  local_40 = buffer;
  pcVar6 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar6 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xe7,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00b2d659;
    *puVar7 = 0;
  }
  if (local_40 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xe8,"(buffer)","buffer");
    if (!bVar2) goto LAB_00b2d659;
    *puVar7 = 0;
  }
  if ((int)local_48 < 1) {
    uVar9 = 0;
  }
  else {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar9 = 0;
    local_5c = (int)local_70 + 1U & 0xff;
    iVar10 = 0;
    do {
      this_00 = items[iVar10];
      if (this_00 != (JavascriptString *)0x0) {
        pcVar6 = JavascriptString::UnsafeGetBuffer(this_00);
        if (pcVar6 == (char16 *)0x0) {
          if (iVar10 == (int)local_48 + -1) {
            iVar5 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x69])
                              (this_00,&local_80);
            if (iVar5 != -1) {
              iVar10 = -1;
              items = local_80;
              local_48 = CONCAT44(extraout_var,iVar5);
              goto LAB_00b2d5d4;
            }
          }
          cVar3 = JavascriptString::GetLength(this_00);
          cVar4 = JavascriptString::GetLength(local_58);
          if (cVar4 - uVar9 < cVar3) {
            AssertCount = AssertCount + 1;
            local_38 = items;
            Throw::LogAssert();
            puVar7 = local_50;
            *local_50 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,0x10d,"(copyCharLength <= GetLength() - copiedCharLength)",
                                        "copyCharLength <= GetLength() - copiedCharLength");
            if (!bVar2) goto LAB_00b2d659;
            *puVar7 = 0;
            items = local_38;
          }
          if ((byte)local_70 == 3) {
            iVar5 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(this_00);
            if ((char)iVar5 == '\0') goto LAB_00b2d5b7;
            StringCopyInfo::StringCopyInfo(&local_98,this_00,local_40 + uVar9);
            copyInfo.destinationBuffer = local_98.destinationBuffer;
            copyInfo.sourceString = local_98.sourceString;
            copyInfo.isInitialized = local_98.isInitialized;
            copyInfo._17_7_ = local_98._17_7_;
            StringCopyInfoStack::Push(local_68,copyInfo);
          }
          else {
            if (3 < (byte)local_70) {
              AssertCount = AssertCount + 1;
              local_38 = items;
              Throw::LogAssert();
              puVar7 = local_50;
              *local_50 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                          ,0x118,"(recursionDepth <= MaxCopyRecursionDepth)",
                                          "recursionDepth <= MaxCopyRecursionDepth");
              if (!bVar2) goto LAB_00b2d659;
              *puVar7 = 0;
              items = local_38;
            }
LAB_00b2d5b7:
            JavascriptString::Copy(this_00,local_40 + uVar9,local_68,(byte)local_5c);
          }
          uVar9 = cVar3 + uVar9;
        }
        else {
          local_38 = items;
          cVar3 = JavascriptString::GetLength(this_00);
          uVar8 = cVar3 + uVar9;
          cVar4 = JavascriptString::GetLength(local_58);
          if (cVar4 < uVar8) {
            AssertCount = AssertCount + 1;
            newItems = (JavascriptString **)(ulong)cVar3;
            Throw::LogAssert();
            puVar7 = local_50;
            *local_50 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,0xf7,
                                        "(copiedCharLength + copyCharLength <= this->GetLength())",
                                        "copiedCharLength + copyCharLength <= this->GetLength()");
            if (!bVar2) goto LAB_00b2d659;
            *puVar7 = 0;
            cVar3 = (charcount_t)newItems;
          }
          pcVar6 = local_40 + uVar9;
          str = JavascriptString::GetString(this_00);
          JavascriptString::CopyHelper(pcVar6,str,cVar3);
          items = local_38;
          uVar9 = uVar8;
        }
      }
LAB_00b2d5d4:
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)local_48);
  }
  cVar3 = JavascriptString::GetLength(local_58);
  if (uVar9 != cVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x11e,"(copiedCharLength == GetLength())",
                                "copiedCharLength == GetLength()");
    if (!bVar2) {
LAB_00b2d659:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void ConcatStringBase::CopyImpl(_Out_writes_(m_charLength) char16 *const buffer,
            int itemCount, _In_reads_(itemCount) JavascriptString * const * items,
            StringCopyInfoStack &nestedStringTreeCopyInfos, const byte recursionDepth)
    {

        Assert(!IsFinalized());
        Assert(buffer);

        CharCount copiedCharLength = 0;
        for(int i = 0; i < itemCount; ++i)
        {
            JavascriptString *const s = items[i];
            if(!s)
            {
                continue;
            }

            if (s->IsFinalized())
            {
                // If we have the buffer already, just copy it
                const CharCount copyCharLength = s->GetLength();
                AnalysisAssert(copiedCharLength + copyCharLength <= this->GetLength());
                CopyHelper(&buffer[copiedCharLength], s->GetString(), copyCharLength);
                copiedCharLength += copyCharLength;
                continue;
            }

            if(i == itemCount - 1)
            {
                JavascriptString * const * newItems;
                int newItemCount = s->GetRandomAccessItemsFromConcatString(newItems);
                if (newItemCount != -1)
                {
                    // Optimize for right-weighted ConcatString tree (the append case). Even though appending to a ConcatString will
                    // transition into a CompoundString fairly quickly, strings created by doing just a few appends are very common.
                    items = newItems;
                    itemCount = newItemCount;
                    i = -1;
                    continue;
                }
            }

            const CharCount copyCharLength = s->GetLength();
            AnalysisAssert(copyCharLength <= GetLength() - copiedCharLength);

            if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
            {
                // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                // the caller can deal with those after returning.
                nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[copiedCharLength]));
            }
            else
            {
                Assert(recursionDepth <= MaxCopyRecursionDepth);
                s->Copy(&buffer[copiedCharLength], nestedStringTreeCopyInfos, recursionDepth + 1);
            }
            copiedCharLength += copyCharLength;
        }

        Assert(copiedCharLength == GetLength());
    }